

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

int Dam_ManUpdateNode(Dam_Man_t *p,int iObj,int iLit0,int iLit1,int iLitNew,Vec_Int_t *vDivs)

{
  Hash_IntMan_t *p_00;
  int *piVar1;
  float *pfVar2;
  Vec_Que_t *pVVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  bool bVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint local_84;
  
  if (iObj < p->vNod2Set->nSize) {
    if (iObj < 0) {
LAB_00707464:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar16 = p->vNod2Set->pArray[(uint)iObj];
    if ((ulong)uVar16 != 0) {
      if (((int)uVar16 < 0) || (p->vSetStore->nSize <= (int)uVar16)) {
LAB_007073e8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar18 = (uint *)(p->vSetStore->pArray + uVar16);
      goto LAB_00706ed1;
    }
  }
  puVar18 = (uint *)0x0;
LAB_00706ed1:
  if ((int)*puVar18 < 1) {
    return 0;
  }
  lVar8 = (ulong)*puVar18 + 1;
  lVar9 = 1;
  while (puVar18[lVar9] != iLit0) {
    lVar9 = lVar9 + 1;
    if (lVar8 == lVar9) {
      return 0;
    }
  }
  lVar9 = 1;
  while (puVar18[lVar9] != iLit1) {
    lVar9 = lVar9 + 1;
    if (lVar8 == lVar9) {
      return 0;
    }
  }
  Vec_IntPush(vDivs,-iObj);
  uVar16 = 1;
  if ((int)*puVar18 < 1) {
LAB_007073cc:
    puVar18[(int)uVar16] = iLitNew;
    *puVar18 = uVar16;
    return 1;
  }
  lVar8 = 1;
LAB_00706f72:
  uVar7 = puVar18[lVar8];
  if (uVar7 != iLit1 && uVar7 != iLit0) {
    lVar9 = (long)(int)uVar16;
    uVar16 = uVar16 + 1;
    puVar18[lVar9] = uVar7;
    p_00 = p->vHash;
    pVVar15 = p_00->vTable;
    local_84 = 0;
    iVar12 = 0;
    bVar5 = true;
LAB_00706fcd:
    iVar13 = iLit1;
    if (bVar5) {
      iVar13 = iLit0;
    }
    uVar6 = pVVar15->nSize;
    if (iLit1 < iLit0 != iVar13 < (int)uVar7) {
      uVar19 = (ulong)(iVar13 * 0x1051 + uVar7 * 0x1ec1) % (ulong)uVar6;
      iVar10 = (int)uVar19;
      if ((-1 < iVar10) && (iVar10 < (int)uVar6)) {
        uVar6 = pVVar15->pArray[uVar19];
        if (uVar6 != 0) {
          do {
            if ((int)uVar6 < 0) goto LAB_007073e8;
            uVar17 = uVar6 * 4;
            uVar11 = p_00->vObjs->nSize;
            if (uVar11 == uVar17 || SBORROW4(uVar11,uVar17) != (int)(uVar11 + uVar6 * -4) < 0)
            goto LAB_007073e8;
            piVar1 = p_00->vObjs->pArray;
            if ((piVar1[uVar17] == iVar13) && (piVar1[(ulong)uVar17 + 1] == uVar7))
            goto LAB_007070ca;
            uVar6 = piVar1[(ulong)uVar17 + 3];
          } while (uVar6 != 0);
        }
        goto LAB_007072b2;
      }
      goto LAB_007073e8;
    }
    uVar19 = (ulong)(iVar13 * 0x1ec1 + uVar7 * 0x1051) % (ulong)uVar6;
    iVar10 = (int)uVar19;
    if ((iVar10 < 0) || ((int)uVar6 <= iVar10)) goto LAB_007073e8;
    uVar6 = pVVar15->pArray[uVar19];
    if (uVar6 != 0) {
      do {
        if ((int)uVar6 < 0) goto LAB_007073e8;
        uVar17 = uVar6 * 4;
        uVar11 = p_00->vObjs->nSize;
        if (uVar11 == uVar17 || SBORROW4(uVar11,uVar17) != (int)(uVar11 + uVar6 * -4) < 0)
        goto LAB_007073e8;
        piVar1 = p_00->vObjs->pArray;
        if ((piVar1[uVar17] == uVar7) && (piVar1[(ulong)uVar17 + 1] == iVar13)) goto LAB_007070ca;
        uVar6 = piVar1[(ulong)uVar17 + 3];
      } while (uVar6 != 0);
    }
    goto LAB_007072b2;
  }
  goto LAB_007073b9;
LAB_007070ca:
  if (p->vCounts->nSize <= (int)uVar6) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                  ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
  }
  pfVar2 = p->vCounts->pArray;
  pfVar2[uVar6] = pfVar2[uVar6] + -1.0;
  pVVar3 = p->vQue;
  if ((int)uVar6 < pVVar3->nCap) {
    piVar1 = pVVar3->pOrder;
    uVar17 = piVar1[uVar6];
    uVar19 = (ulong)(int)uVar17;
    if (-1 < (long)uVar19) {
      pfVar2 = *pVVar3->pCostsFlt;
      if (pfVar2 == (float *)0x0) {
        fVar22 = (float)(int)uVar6;
      }
      else {
        fVar22 = pfVar2[uVar6];
      }
      piVar4 = pVVar3->pHeap;
      if (piVar4[uVar19] != uVar6) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar17 < 2) {
        piVar4[uVar19] = uVar6;
        piVar1[uVar6] = uVar17;
LAB_007071b6:
        if (pfVar2 == (float *)0x0) {
          fVar22 = (float)(int)uVar6;
        }
        else {
          fVar22 = pfVar2[uVar6];
        }
        uVar17 = (int)uVar19 * 2;
        iVar13 = pVVar3->nSize;
        iVar10 = (int)uVar19;
        if ((int)uVar17 < iVar13) {
          do {
            iVar10 = (int)uVar19;
            uVar11 = uVar17 | 1;
            if ((int)uVar11 < iVar13) {
              if (pfVar2 == (float *)0x0) {
                fVar23 = (float)piVar4[(int)uVar17];
                fVar24 = (float)piVar4[(int)uVar11];
              }
              else {
                fVar23 = pfVar2[piVar4[(int)uVar17]];
                fVar24 = pfVar2[piVar4[(int)uVar11]];
              }
              uVar19 = (ulong)uVar17;
              if (fVar23 < fVar24) {
                uVar19 = (ulong)uVar11;
              }
            }
            else {
              uVar19 = (ulong)uVar17;
            }
            iVar14 = (int)uVar19;
            if (iVar13 <= iVar14) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar13 = piVar4[iVar14];
            if (pfVar2 == (float *)0x0) {
              fVar23 = (float)iVar13;
            }
            else {
              fVar23 = pfVar2[iVar13];
            }
            if (fVar23 <= fVar22) break;
            piVar4[iVar10] = iVar13;
            piVar1[iVar13] = iVar10;
            uVar17 = iVar14 * 2;
            iVar13 = pVVar3->nSize;
            iVar10 = iVar14;
          } while ((int)uVar17 < iVar13);
        }
        uVar21 = (ulong)iVar10;
      }
      else {
        bVar20 = true;
        uVar21 = (ulong)uVar17;
        do {
          uVar21 = uVar21 >> 1;
          iVar13 = piVar4[uVar21];
          if (pfVar2 == (float *)0x0) {
            fVar23 = (float)iVar13;
          }
          else {
            fVar23 = pfVar2[iVar13];
          }
          uVar17 = (uint)uVar19;
          if (fVar22 <= fVar23) {
            piVar4[uVar19 & 0xffffffff] = uVar6;
            piVar1[uVar6] = uVar17;
            if (bVar20) goto LAB_007071b6;
            goto LAB_00707299;
          }
          piVar4[uVar19 & 0xffffffff] = iVar13;
          piVar1[iVar13] = uVar17;
          bVar20 = false;
          iVar10 = (int)uVar21;
          uVar19 = uVar21;
        } while (3 < uVar17);
      }
      piVar4[uVar21] = uVar6;
      piVar1[uVar6] = iVar10;
LAB_00707299:
      local_84 = local_84 | 1 << iVar12;
    }
  }
LAB_007072b2:
  iVar12 = 1;
  bVar20 = !bVar5;
  bVar5 = false;
  if (bVar20) goto code_r0x007072c7;
  goto LAB_00706fcd;
code_r0x007072c7:
  if (local_84 == 3) {
    uVar6 = iLitNew;
    uVar17 = uVar7;
    if (iLit1 < iLit0 != iLitNew < (int)uVar7) {
      uVar6 = uVar7;
      uVar17 = iLitNew;
    }
    uVar7 = Hash_Int2ManInsert(p_00,uVar17,uVar6,uVar7);
    if ((int)uVar7 < 0) goto LAB_007073e8;
    pVVar15 = p->vHash->vObjs;
    uVar6 = uVar7 * 4;
    uVar17 = pVVar15->nSize;
    if (uVar17 == uVar6 || SBORROW4(uVar17,uVar6) != (int)(uVar17 + uVar7 * -4) < 0)
    goto LAB_007073e8;
    piVar1 = pVVar15->pArray + (ulong)uVar6 + 2;
    *piVar1 = *piVar1 + 1;
    Vec_IntPush(vDivs,uVar7);
    pVVar15 = p->vDivLevR;
    if (pVVar15->nSize <= (int)uVar7) {
      Vec_IntFillExtra(pVVar15,(pVVar15->nSize * 3) / 2,0);
      pVVar15 = p->vDivLevR;
    }
    if (((iObj < 0) || (p->vNodLevR->nSize <= iObj)) || (pVVar15->nSize <= (int)uVar7))
    goto LAB_00707464;
    iVar12 = p->vNodLevR->pArray[(uint)iObj];
    if (pVVar15->pArray[uVar7] < iVar12) {
      pVVar15->pArray[uVar7] = iVar12;
    }
  }
LAB_007073b9:
  bVar5 = (int)*puVar18 <= lVar8;
  lVar8 = lVar8 + 1;
  if (bVar5) goto LAB_007073cc;
  goto LAB_00706f72;
}

Assistant:

int Dam_ManUpdateNode( Dam_Man_t * p, int iObj, int iLit0, int iLit1, int iLitNew, Vec_Int_t * vDivs )
{
    int * pSet = Dam_ObjSet( p, iObj );
    int i, k, c, Num, iLit, iLit2, fPres;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit0 )
            break;
    if ( i > pSet[0] )
        return 0;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit1 )
            break;
    if ( i > pSet[0] )
        return 0;
    // compact literals
    Vec_IntPush( vDivs, -iObj );
    for ( k = i = 1; i <= pSet[0]; i++ )
    {
        if ( iLit0 == pSet[i] || iLit1 == pSet[i] )
            continue;
        pSet[k++] = iLit = pSet[i];
        // reduce weights of the divisors
        fPres = 0;
        for ( c = 0; c < 2; c++ )
        {
            iLit2 = c ? iLit1 : iLit0;
            if ( (iLit > iLit2) ^ (iLit0 > iLit1) )
                Num = *Hash_Int2ManLookup( p->vHash, iLit2, iLit );
            else
                Num = *Hash_Int2ManLookup( p->vHash, iLit, iLit2 );
            if ( Num > 0 )
            {
                Vec_FltAddToEntry( p->vCounts, Num, -1 );
                if ( Vec_QueIsMember(p->vQue, Num) )
                {
                    Vec_QueUpdate( p->vQue, Num );
                    fPres |= (1 << c);
                }
            }
        }
        if ( fPres != 3 )
            continue;
        if ( (iLit > iLitNew) ^ (iLit0 > iLit1) )
            Num = Hash_Int2ManInsert( p->vHash, iLitNew, iLit, 0 );
        else
            Num = Hash_Int2ManInsert( p->vHash, iLit, iLitNew, 0 );
        Hash_Int2ObjInc( p->vHash, Num );
        Vec_IntPush( vDivs, Num );
        // update reverse level
        if ( Num >= Vec_IntSize(p->vDivLevR) )
            Vec_IntFillExtra( p->vDivLevR, 3 * Vec_IntSize(p->vDivLevR) / 2, 0 );
        Vec_IntUpdateEntry( p->vDivLevR, Num, Vec_IntEntry(p->vNodLevR, iObj) );
    }
    pSet[k] = iLitNew;
    pSet[0] = k;
    return 1;
}